

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O2

bool __thiscall
axl::sl::
BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::setPattern(BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
             *this,StringRef_utf32 *pattern)

{
  size_t count;
  wchar_t wVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  size_t i;
  size_t sVar4;
  
  count = pattern->m_length;
  sVar2 = Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::copyReverse
                    ((Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *)this,pattern->m_p,count);
  if (sVar2 != 0) {
    pwVar3 = Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::p
                       ((Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *)this);
    for (sVar4 = 0; count != sVar4; sVar4 = sVar4 + 1) {
      wVar1 = enc::toCaseFolded(pwVar3[sVar4]);
      pwVar3[sVar4] = wVar1;
    }
    BoyerMooreSkipTablesBase<wchar_t>::build
              (&(this->
                super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
                ).m_skipTables,
               (this->
               super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
               ).m_pattern.super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_p,count,0x100)
    ;
  }
  return sVar2 != 0;
}

Assistant:

bool
	setPattern(const sl::StringRef_utf32& pattern) {
		size_t length = pattern.getLength();
		bool result = IsReverse ?
			this->m_pattern.copyReverse(pattern.cp(), length) :
			this->m_pattern.copy(pattern.cp(), length);

		if (!result)
			return false;

		if (IsCaseFolded) {
			typename Array<typename Details::C>::Rwi rwi = this->m_pattern;
			for (size_t i = 0; i < length; i++)
				rwi[i] = CaseOp()(rwi[i]);
		}

		this->m_skipTables.build(this->m_pattern, length, Details::BadSkipTableSize);
		return true;
	}